

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O0

void orphanage_tests::MakeNewKeyWithFastRandomContext(CKey *key,FastRandomContext *rand_ctx)

{
  bool bVar1;
  uchar *pbegin;
  RandomMixin<FastRandomContext> *in_RSI;
  CKey *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> keydata;
  CKey *in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 fCompressedIn;
  uchar *pend;
  size_t in_stack_ffffffffffffffb0;
  undefined1 local_38 [24];
  uchar local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pend = local_20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff68);
  fCompressedIn = (undefined1)((ulong)local_38 >> 0x38);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>(in_RSI,in_stack_ffffffffffffffb0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff68);
  pbegin = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_ffffffffffffff68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff68);
  CKey::Set<unsigned_char*>(in_RDI,pbegin,pend,(bool)fCompressedIn);
  bVar1 = CKey::IsValid(in_stack_ffffffffffffff68);
  if (!bVar1) {
    __assert_fail("key.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/orphanage_tests.cpp"
                  ,0x33,
                  "void orphanage_tests::MakeNewKeyWithFastRandomContext(CKey &, FastRandomContext &)"
                 );
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(bVar1,in_stack_ffffffffffffff78));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void MakeNewKeyWithFastRandomContext(CKey& key, FastRandomContext& rand_ctx)
{
    std::vector<unsigned char> keydata;
    keydata = rand_ctx.randbytes(32);
    key.Set(keydata.data(), keydata.data() + keydata.size(), /*fCompressedIn=*/true);
    assert(key.IsValid());
}